

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ActivationParams::MergeFrom(ActivationParams *this,ActivationParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  ActivationELU *this_00;
  ActivationSoftplus *this_01;
  ActivationScaledTanh *this_02;
  ActivationSoftsign *this_03;
  ActivationParametricSoftplus *this_04;
  ActivationSigmoid *this_05;
  ActivationLinear *this_06;
  ActivationThresholdedReLU *this_07;
  ActivationReLU *this_08;
  ActivationPReLU *this_09;
  ActivationSigmoidHard *this_10;
  ActivationLeakyReLU *this_11;
  ActivationTanh *this_12;
  ActivationELU *from_00;
  ActivationSoftplus *from_01;
  ActivationScaledTanh *from_02;
  ActivationSoftsign *from_03;
  ActivationParametricSoftplus *from_04;
  ActivationSigmoid *from_05;
  ActivationLinear *from_06;
  ActivationThresholdedReLU *from_07;
  ActivationReLU *from_08;
  ActivationPReLU *from_09;
  ActivationSigmoidHard *from_10;
  ActivationLeakyReLU *from_11;
  ActivationTanh *from_12;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1977);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 0x1f) {
    if (0x13 < (int)uVar1) {
      if (uVar1 != 0x14) {
        if (uVar1 != 0x19) {
          if (uVar1 != 0x1e) {
            return;
          }
          if (this->_oneof_case_[0] == 0x1e) {
            this_12 = (this->NonlinearityType_).tanh_;
          }
          else {
            clear_NonlinearityType(this);
            this->_oneof_case_[0] = 0x1e;
            this_12 = (ActivationTanh *)operator_new(0x18);
            ActivationTanh::ActivationTanh(this_12);
            (this->NonlinearityType_).tanh_ = this_12;
            if (from->_oneof_case_[0] != 0x1e) {
              protobuf_NeuralNetwork_2eproto::InitDefaults();
              from_12 = (ActivationTanh *)&_ActivationTanh_default_instance_;
              goto LAB_0046028c;
            }
          }
          from_12 = (from->NonlinearityType_).tanh_;
LAB_0046028c:
          ActivationTanh::MergeFrom(this_12,from_12);
          return;
        }
        if (this->_oneof_case_[0] == 0x19) {
          this_09 = (this->NonlinearityType_).prelu_;
        }
        else {
          clear_NonlinearityType(this);
          this->_oneof_case_[0] = 0x19;
          this_09 = (ActivationPReLU *)operator_new(0x20);
          ActivationPReLU::ActivationPReLU(this_09);
          (this->NonlinearityType_).prelu_ = this_09;
          if (from->_oneof_case_[0] != 0x19) {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            from_09 = (ActivationPReLU *)&_ActivationPReLU_default_instance_;
            goto LAB_0046024a;
          }
        }
        from_09 = (from->NonlinearityType_).prelu_;
LAB_0046024a:
        ActivationPReLU::MergeFrom(this_09,from_09);
        return;
      }
      if (this->_oneof_case_[0] == 0x14) {
        this_07 = (this->NonlinearityType_).thresholdedrelu_;
      }
      else {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x14;
        this_07 = (ActivationThresholdedReLU *)operator_new(0x18);
        ActivationThresholdedReLU::ActivationThresholdedReLU(this_07);
        (this->NonlinearityType_).thresholdedrelu_ = this_07;
        if (from->_oneof_case_[0] != 0x14) {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_07 = (ActivationThresholdedReLU *)&_ActivationThresholdedReLU_default_instance_;
          goto LAB_0046021e;
        }
      }
      from_07 = (from->NonlinearityType_).thresholdedrelu_;
LAB_0046021e:
      ActivationThresholdedReLU::MergeFrom(this_07,from_07);
      return;
    }
    if (uVar1 != 5) {
      if (uVar1 != 10) {
        if (uVar1 != 0xf) {
          return;
        }
        if (this->_oneof_case_[0] == 0xf) {
          this_11 = (this->NonlinearityType_).leakyrelu_;
        }
        else {
          clear_NonlinearityType(this);
          this->_oneof_case_[0] = 0xf;
          this_11 = (ActivationLeakyReLU *)operator_new(0x18);
          ActivationLeakyReLU::ActivationLeakyReLU(this_11);
          (this->NonlinearityType_).leakyrelu_ = this_11;
          if (from->_oneof_case_[0] != 0xf) {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            from_11 = (ActivationLeakyReLU *)&_ActivationLeakyReLU_default_instance_;
            goto LAB_00460276;
          }
        }
        from_11 = (from->NonlinearityType_).leakyrelu_;
LAB_00460276:
        ActivationLeakyReLU::MergeFrom(this_11,from_11);
        return;
      }
      if (this->_oneof_case_[0] == 10) {
        this_08 = (this->NonlinearityType_).relu_;
      }
      else {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 10;
        this_08 = (ActivationReLU *)operator_new(0x18);
        ActivationReLU::ActivationReLU(this_08);
        (this->NonlinearityType_).relu_ = this_08;
        if (from->_oneof_case_[0] != 10) {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_08 = (ActivationReLU *)&_ActivationReLU_default_instance_;
          goto LAB_00460234;
        }
      }
      from_08 = (from->NonlinearityType_).relu_;
LAB_00460234:
      ActivationReLU::MergeFrom(this_08,from_08);
      return;
    }
    if (this->_oneof_case_[0] == 5) {
      this_06 = (this->NonlinearityType_).linear_;
    }
    else {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 5;
      this_06 = (ActivationLinear *)operator_new(0x20);
      ActivationLinear::ActivationLinear(this_06);
      (this->NonlinearityType_).linear_ = this_06;
      if (from->_oneof_case_[0] != 5) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_06 = (ActivationLinear *)&_ActivationLinear_default_instance_;
        goto LAB_00460205;
      }
    }
    from_06 = (from->NonlinearityType_).linear_;
LAB_00460205:
    ActivationLinear::MergeFrom(this_06,from_06);
    return;
  }
  if (0x31 < (int)uVar1) {
    if (0x45 < (int)uVar1) {
      if (uVar1 != 0x46) {
        if (uVar1 != 0x47) {
          return;
        }
        if (this->_oneof_case_[0] == 0x47) {
          this_04 = (this->NonlinearityType_).parametricsoftplus_;
        }
        else {
          clear_NonlinearityType(this);
          this->_oneof_case_[0] = 0x47;
          this_04 = (ActivationParametricSoftplus *)operator_new(0x28);
          ActivationParametricSoftplus::ActivationParametricSoftplus(this_04);
          (this->NonlinearityType_).parametricsoftplus_ = this_04;
          if (from->_oneof_case_[0] != 0x47) {
            protobuf_NeuralNetwork_2eproto::InitDefaults();
            from_04 = (ActivationParametricSoftplus *)
                      &_ActivationParametricSoftplus_default_instance_;
            goto LAB_004601d3;
          }
        }
        from_04 = (from->NonlinearityType_).parametricsoftplus_;
LAB_004601d3:
        ActivationParametricSoftplus::MergeFrom(this_04,from_04);
        return;
      }
      if (this->_oneof_case_[0] == 0x46) {
        this_01 = (this->NonlinearityType_).softplus_;
      }
      else {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x46;
        this_01 = (ActivationSoftplus *)operator_new(0x18);
        ActivationSoftplus::ActivationSoftplus(this_01);
        (this->NonlinearityType_).softplus_ = this_01;
        if (from->_oneof_case_[0] != 0x46) {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_01 = (ActivationSoftplus *)&_ActivationSoftplus_default_instance_;
          goto LAB_00460188;
        }
      }
      from_01 = (from->NonlinearityType_).softplus_;
LAB_00460188:
      ActivationSoftplus::MergeFrom(this_01,from_01);
      return;
    }
    if (uVar1 != 0x32) {
      if (uVar1 != 0x3c) {
        return;
      }
      if (this->_oneof_case_[0] == 0x3c) {
        this_03 = (this->NonlinearityType_).softsign_;
      }
      else {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x3c;
        this_03 = (ActivationSoftsign *)operator_new(0x18);
        ActivationSoftsign::ActivationSoftsign(this_03);
        (this->NonlinearityType_).softsign_ = this_03;
        if (from->_oneof_case_[0] != 0x3c) {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_03 = (ActivationSoftsign *)&_ActivationSoftsign_default_instance_;
          goto LAB_004601ba;
        }
      }
      from_03 = (from->NonlinearityType_).softsign_;
LAB_004601ba:
      ActivationSoftsign::MergeFrom(this_03,from_03);
      return;
    }
    if (this->_oneof_case_[0] == 0x32) {
      this_00 = (this->NonlinearityType_).elu_;
    }
    else {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x32;
      this_00 = (ActivationELU *)operator_new(0x18);
      ActivationELU::ActivationELU(this_00);
      (this->NonlinearityType_).elu_ = this_00;
      if (from->_oneof_case_[0] != 0x32) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (ActivationELU *)&_ActivationELU_default_instance_;
        goto LAB_0046016f;
      }
    }
    from_00 = (from->NonlinearityType_).elu_;
LAB_0046016f:
    ActivationELU::MergeFrom(this_00,from_00);
    return;
  }
  if (uVar1 != 0x1f) {
    if (uVar1 != 0x28) {
      if (uVar1 != 0x29) {
        return;
      }
      if (this->_oneof_case_[0] == 0x29) {
        this_10 = (this->NonlinearityType_).sigmoidhard_;
      }
      else {
        clear_NonlinearityType(this);
        this->_oneof_case_[0] = 0x29;
        this_10 = (ActivationSigmoidHard *)operator_new(0x20);
        ActivationSigmoidHard::ActivationSigmoidHard(this_10);
        (this->NonlinearityType_).sigmoidhard_ = this_10;
        if (from->_oneof_case_[0] != 0x29) {
          protobuf_NeuralNetwork_2eproto::InitDefaults();
          from_10 = (ActivationSigmoidHard *)&_ActivationSigmoidHard_default_instance_;
          goto LAB_00460260;
        }
      }
      from_10 = (from->NonlinearityType_).sigmoidhard_;
LAB_00460260:
      ActivationSigmoidHard::MergeFrom(this_10,from_10);
      return;
    }
    if (this->_oneof_case_[0] == 0x28) {
      this_05 = (this->NonlinearityType_).sigmoid_;
    }
    else {
      clear_NonlinearityType(this);
      this->_oneof_case_[0] = 0x28;
      this_05 = (ActivationSigmoid *)operator_new(0x18);
      ActivationSigmoid::ActivationSigmoid(this_05);
      (this->NonlinearityType_).sigmoid_ = this_05;
      if (from->_oneof_case_[0] != 0x28) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_05 = (ActivationSigmoid *)&_ActivationSigmoid_default_instance_;
        goto LAB_004601ec;
      }
    }
    from_05 = (from->NonlinearityType_).sigmoid_;
LAB_004601ec:
    ActivationSigmoid::MergeFrom(this_05,from_05);
    return;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    this_02 = (this->NonlinearityType_).scaledtanh_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x1f;
    this_02 = (ActivationScaledTanh *)operator_new(0x20);
    ActivationScaledTanh::ActivationScaledTanh(this_02);
    (this->NonlinearityType_).scaledtanh_ = this_02;
    if (from->_oneof_case_[0] != 0x1f) {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_02 = (ActivationScaledTanh *)&_ActivationScaledTanh_default_instance_;
      goto LAB_004601a1;
    }
  }
  from_02 = (from->NonlinearityType_).scaledtanh_;
LAB_004601a1:
  ActivationScaledTanh::MergeFrom(this_02,from_02);
  return;
}

Assistant:

void ActivationParams::MergeFrom(const ActivationParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ActivationParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.NonlinearityType_case()) {
    case kLinear: {
      mutable_linear()->::CoreML::Specification::ActivationLinear::MergeFrom(from.linear());
      break;
    }
    case kReLU: {
      mutable_relu()->::CoreML::Specification::ActivationReLU::MergeFrom(from.relu());
      break;
    }
    case kLeakyReLU: {
      mutable_leakyrelu()->::CoreML::Specification::ActivationLeakyReLU::MergeFrom(from.leakyrelu());
      break;
    }
    case kThresholdedReLU: {
      mutable_thresholdedrelu()->::CoreML::Specification::ActivationThresholdedReLU::MergeFrom(from.thresholdedrelu());
      break;
    }
    case kPReLU: {
      mutable_prelu()->::CoreML::Specification::ActivationPReLU::MergeFrom(from.prelu());
      break;
    }
    case kTanh: {
      mutable_tanh()->::CoreML::Specification::ActivationTanh::MergeFrom(from.tanh());
      break;
    }
    case kScaledTanh: {
      mutable_scaledtanh()->::CoreML::Specification::ActivationScaledTanh::MergeFrom(from.scaledtanh());
      break;
    }
    case kSigmoid: {
      mutable_sigmoid()->::CoreML::Specification::ActivationSigmoid::MergeFrom(from.sigmoid());
      break;
    }
    case kSigmoidHard: {
      mutable_sigmoidhard()->::CoreML::Specification::ActivationSigmoidHard::MergeFrom(from.sigmoidhard());
      break;
    }
    case kELU: {
      mutable_elu()->::CoreML::Specification::ActivationELU::MergeFrom(from.elu());
      break;
    }
    case kSoftsign: {
      mutable_softsign()->::CoreML::Specification::ActivationSoftsign::MergeFrom(from.softsign());
      break;
    }
    case kSoftplus: {
      mutable_softplus()->::CoreML::Specification::ActivationSoftplus::MergeFrom(from.softplus());
      break;
    }
    case kParametricSoftplus: {
      mutable_parametricsoftplus()->::CoreML::Specification::ActivationParametricSoftplus::MergeFrom(from.parametricsoftplus());
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
}